

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTS_model.c
# Opt level: O0

void HTS_Node_clear(HTS_Node *node)

{
  HTS_Node *in_RDI;
  
  if (in_RDI->yes != (_HTS_Node *)0x0) {
    HTS_Node_clear((HTS_Node *)0x1984bd);
    HTS_free((void *)0x1984ca);
  }
  if (in_RDI->no != (_HTS_Node *)0x0) {
    HTS_Node_clear((HTS_Node *)0x1984e2);
    HTS_free((void *)0x1984ef);
  }
  HTS_Node_initialize(in_RDI);
  return;
}

Assistant:

static void HTS_Node_clear(HTS_Node * node)
{
   if (node->yes != NULL) {
      HTS_Node_clear(node->yes);
      HTS_free(node->yes);
   }
   if (node->no != NULL) {
      HTS_Node_clear(node->no);
      HTS_free(node->no);
   }
   HTS_Node_initialize(node);
}